

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

ArgSortLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_argsort(NeuralNetworkLayer *this)

{
  ulong uVar1;
  ArgSortLayerParams *pAVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] != 0x5b5) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x5b5;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    pAVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArgSortLayerParams>
                       (arena);
    (this->layer_).argsort_ = pAVar2;
  }
  return (ArgSortLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ArgSortLayerParams* NeuralNetworkLayer::_internal_mutable_argsort() {
  if (!_internal_has_argsort()) {
    clear_layer();
    set_has_argsort();
    layer_.argsort_ = CreateMaybeMessage< ::CoreML::Specification::ArgSortLayerParams >(GetArenaForAllocation());
  }
  return layer_.argsort_;
}